

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void duckdb::AggregateStateCombine(DataChunk *input,ExpressionState *state_p,Vector *result)

{
  PhysicalType PVar1;
  uint uVar2;
  ExportAggregateBindData *pEVar3;
  FunctionLocalState *pFVar4;
  reference pvVar5;
  ulong uVar6;
  IOException *pIVar7;
  ulong len;
  idx_t len_00;
  unsigned_long *len_01;
  data_ptr_t pdVar8;
  uint *puVar9;
  Vector *pVVar10;
  ulong uVar11;
  ulong idx;
  uint *puVar12;
  anon_union_16_2_67f50693_for_value aVar13;
  string_t sVar14;
  allocator local_141;
  Vector *local_140;
  Vector *local_138;
  Vector *local_130;
  ArenaAllocator *local_128;
  AggregateInputData aggr_input_data;
  UnifiedVectorFormat state0_data;
  UnifiedVectorFormat state1_data;
  string local_70;
  string local_50;
  
  local_140 = result;
  pEVar3 = ExportAggregateBindData::GetFrom(state_p);
  state0_data.sel = (SelectionVector *)state_p[1]._vptr_ExpressionState;
  pFVar4 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&state0_data);
  local_128 = (ArenaAllocator *)(pFVar4 + 0x1e);
  ArenaAllocator::Reset(local_128);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  PVar1 = (pvVar5->type).physical_type_;
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
  if (PVar1 != (pvVar5->type).physical_type_) {
    pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&state0_data,"Aggregate state combine type mismatch, expect %s, got %s",
               (allocator *)&state1_data);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    LogicalType::ToString_abi_cxx11_(&local_50,&pvVar5->type);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
    LogicalType::ToString_abi_cxx11_(&local_70,&pvVar5->type);
    IOException::IOException<std::__cxx11::string,std::__cxx11::string>
              (pIVar7,(string *)&state0_data,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&state0_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&state1_data);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  Vector::ToUnifiedFormat(pvVar5,input->count,&state0_data);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
  Vector::ToUnifiedFormat(pvVar5,input->count,&state1_data);
  local_130 = (Vector *)(pFVar4 + 4);
  local_138 = (Vector *)(pFVar4 + 0x11);
  pdVar8 = local_140->data + 8;
  idx = 0;
  do {
    if (input->count <= idx) {
      UnifiedVectorFormat::~UnifiedVectorFormat(&state1_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&state0_data);
      return;
    }
    len = idx;
    if ((state0_data.sel)->sel_vector != (sel_t *)0x0) {
      len = (ulong)(state0_data.sel)->sel_vector[idx];
    }
    uVar6 = idx;
    if ((state1_data.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(state1_data.sel)->sel_vector[idx];
    }
    puVar12 = (uint *)(state0_data.data + len * 0x10);
    puVar9 = (uint *)(state1_data.data + uVar6 * 0x10);
    if (state0_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
LAB_01556bda:
      if ((state1_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((state1_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
           >> (uVar6 & 0x3f) & 1) != 0)) {
        if (state0_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          uVar11 = 1L << ((byte)len & 0x3f);
LAB_01556c0e:
          if (((state0_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [len >> 6] & uVar11) == 0) &&
             ((len_01 = state1_data.validity.super_TemplatedValidityMask<unsigned_long>.
                        validity_mask,
              state1_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
              (len_01 = (unsigned_long *)
                        state1_data.validity.super_TemplatedValidityMask<unsigned_long>.
                        validity_mask[uVar6 >> 6], ((ulong)len_01 >> (uVar6 & 0x3f) & 1) != 0)))) {
            if (*puVar9 < 0xd) {
              pVVar10 = (Vector *)(puVar9 + 1);
            }
            else {
              pVVar10 = *(Vector **)(puVar9 + 2);
            }
            sVar14 = StringVector::AddStringOrBlob
                               ((StringVector *)local_140,pVVar10,(char *)pEVar3->state_size,
                                (idx_t)len_01);
            *(long *)(pdVar8 + -8) = sVar14.value._0_8_;
            *(long *)pdVar8 = sVar14.value._8_8_;
            goto LAB_01556d5a;
          }
        }
        uVar2 = *puVar12;
        if ((pEVar3->state_size != (ulong)uVar2) || (uVar2 != *puVar9)) {
          pIVar7 = (IOException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&aggr_input_data,
                     "Aggregate state size mismatch, expect %llu, got %llu and %llu",&local_141);
          IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                    (pIVar7,(string *)&aggr_input_data,pEVar3->state_size,(ulong)*puVar12,
                     (ulong)*puVar9);
          __cxa_throw(pIVar7,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (uVar2 < 0xd) {
          puVar12 = puVar12 + 1;
        }
        else {
          puVar12 = *(uint **)(puVar12 + 2);
        }
        switchD_016b45db::default(pFVar4[2]._vptr_FunctionLocalState,puVar12,(ulong)uVar2);
        if (*puVar9 < 0xd) {
          puVar9 = puVar9 + 1;
        }
        else {
          puVar9 = *(uint **)(puVar9 + 2);
        }
        switchD_016b45db::default(pFVar4[3]._vptr_FunctionLocalState,puVar9,pEVar3->state_size);
        aggr_input_data.bind_data.ptr = (FunctionData *)0x0;
        aggr_input_data.allocator = local_128;
        aggr_input_data.combine_type = ALLOW_DESTRUCTIVE;
        len_00 = 1;
        (*(pEVar3->aggr).combine)(local_130,local_138,&aggr_input_data,1);
        aVar13.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)
             StringVector::AddStringOrBlob
                       ((StringVector *)local_140,(Vector *)pFVar4[3]._vptr_FunctionLocalState,
                        (char *)pEVar3->state_size,len_00);
      }
      else {
        if (*puVar12 < 0xd) {
          pVVar10 = (Vector *)(puVar12 + 1);
        }
        else {
          pVVar10 = *(Vector **)(puVar12 + 2);
        }
        aVar13.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)
             StringVector::AddStringOrBlob
                       ((StringVector *)local_140,pVVar10,(char *)pEVar3->state_size,len);
      }
      *(long *)(pdVar8 + -8) = aVar13._0_8_;
      *(char **)pdVar8 = aVar13.pointer.ptr;
    }
    else {
      uVar11 = 1L << ((byte)len & 0x3f);
      if ((state0_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[len >> 6]
           >> (len & 0x3f) & 1) != 0) goto LAB_01556bda;
      if ((state1_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((state1_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
           >> (uVar6 & 0x3f) & 1) != 0)) goto LAB_01556c0e;
      FlatVector::SetNull(local_140,idx,true);
    }
LAB_01556d5a:
    idx = idx + 1;
    pdVar8 = pdVar8 + 0x10;
  } while( true );
}

Assistant:

static void AggregateStateCombine(DataChunk &input, ExpressionState &state_p, Vector &result) {
	auto &bind_data = ExportAggregateBindData::GetFrom(state_p);
	auto &local_state = ExecuteFunctionState::GetFunctionState(state_p)->Cast<CombineState>();
	local_state.allocator.Reset();

	D_ASSERT(bind_data.state_size == bind_data.aggr.state_size(bind_data.aggr));

	D_ASSERT(input.data.size() == 2);
	D_ASSERT(input.data[0].GetType().id() == LogicalTypeId::AGGREGATE_STATE);
	D_ASSERT(input.data[0].GetType() == result.GetType());

	if (input.data[0].GetType().InternalType() != input.data[1].GetType().InternalType()) {
		throw IOException("Aggregate state combine type mismatch, expect %s, got %s",
		                  input.data[0].GetType().ToString(), input.data[1].GetType().ToString());
	}

	UnifiedVectorFormat state0_data, state1_data;
	input.data[0].ToUnifiedFormat(input.size(), state0_data);
	input.data[1].ToUnifiedFormat(input.size(), state1_data);

	auto result_ptr = FlatVector::GetData<string_t>(result);

	for (idx_t i = 0; i < input.size(); i++) {
		auto state0_idx = state0_data.sel->get_index(i);
		auto state1_idx = state1_data.sel->get_index(i);

		auto &state0 = UnifiedVectorFormat::GetData<string_t>(state0_data)[state0_idx];
		auto &state1 = UnifiedVectorFormat::GetData<string_t>(state1_data)[state1_idx];

		// if both are NULL, we return NULL. If either of them is not, the result is that one
		if (!state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		if (state0_data.validity.RowIsValid(state0_idx) && !state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state0.GetData()), bind_data.state_size);
			continue;
		}
		if (!state0_data.validity.RowIsValid(state0_idx) && state1_data.validity.RowIsValid(state1_idx)) {
			result_ptr[i] =
			    StringVector::AddStringOrBlob(result, const_char_ptr_cast(state1.GetData()), bind_data.state_size);
			continue;
		}

		// we actually have to combine
		if (state0.GetSize() != bind_data.state_size || state1.GetSize() != bind_data.state_size) {
			throw IOException("Aggregate state size mismatch, expect %llu, got %llu and %llu", bind_data.state_size,
			                  state0.GetSize(), state1.GetSize());
		}

		memcpy(local_state.state_buffer0.get(), state0.GetData(), bind_data.state_size);
		memcpy(local_state.state_buffer1.get(), state1.GetData(), bind_data.state_size);

		AggregateInputData aggr_input_data(nullptr, local_state.allocator, AggregateCombineType::ALLOW_DESTRUCTIVE);
		bind_data.aggr.combine(local_state.state_vector0, local_state.state_vector1, aggr_input_data, 1);

		result_ptr[i] = StringVector::AddStringOrBlob(result, const_char_ptr_cast(local_state.state_buffer1.get()),
		                                              bind_data.state_size);
	}
}